

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::add_blocked_sample
          (TypedTimeSamples<std::array<float,_2UL>_> *this,double t)

{
  undefined1 local_30 [8];
  Sample s;
  double t_local;
  TypedTimeSamples<std::array<float,_2UL>_> *this_local;
  
  s._16_8_ = t;
  Sample::Sample((Sample *)local_30);
  local_30 = (undefined1  [8])s._16_8_;
  s.value._M_elems[0]._0_1_ = 1;
  ::std::
  vector<tinyusdz::TypedTimeSamples<std::array<float,2ul>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::array<float,2ul>>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<std::array<float,2ul>>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<std::array<float,2ul>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::array<float,2ul>>::Sample>>
              *)this,(Sample *)local_30);
  this->_dirty = true;
  return;
}

Assistant:

void add_blocked_sample(const double t) {
    Sample s;
    s.t = t;
    s.blocked = true;
    _samples.emplace_back(s);
    _dirty = true;
  }